

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O0

bool __thiscall
QFontDatabasePrivate::isApplicationFont(QFontDatabasePrivate *this,QString *fileName)

{
  bool bVar1;
  QList<QFontDatabasePrivate::ApplicationFont> *this_00;
  qsizetype qVar2;
  long in_RDI;
  int i;
  QString *in_stack_ffffffffffffffc8;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    this_00 = (QList<QFontDatabasePrivate::ApplicationFont> *)(long)local_1c;
    qVar2 = QList<QFontDatabasePrivate::ApplicationFont>::size
                      ((QList<QFontDatabasePrivate::ApplicationFont> *)(in_RDI + 0x68));
    if (qVar2 <= (long)this_00) {
      return false;
    }
    QList<QFontDatabasePrivate::ApplicationFont>::at(this_00,(qsizetype)in_stack_ffffffffffffffc8);
    bVar1 = ::operator==((QString *)this_00,in_stack_ffffffffffffffc8);
    if (bVar1) break;
    local_1c = local_1c + 1;
  }
  return true;
}

Assistant:

bool QFontDatabasePrivate::isApplicationFont(const QString &fileName)
{
    for (int i = 0; i < applicationFonts.size(); ++i)
        if (applicationFonts.at(i).fileName == fileName)
            return true;
    return false;
}